

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O1

bool __thiscall spvtools::opt::analysis::ScalarConstant::IsZero(ScalarConstant *this)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  undefined4 extraout_var;
  
  iVar3 = (*(this->super_Constant)._vptr_Constant[0x18])();
  piVar2 = *(int **)CONCAT44(extraout_var,iVar3);
  do {
    if (piVar2 == (int *)((undefined8 *)CONCAT44(extraout_var,iVar3))[1]) {
      return true;
    }
    iVar1 = *piVar2;
    piVar2 = piVar2 + 1;
  } while (iVar1 == 0);
  return false;
}

Assistant:

bool IsZero() const override {
    bool is_zero = true;
    for (uint32_t v : words()) {
      if (v != 0) {
        is_zero = false;
        break;
      }
    }
    return is_zero;
  }